

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::list<trompeloeil::condition_base<bool_(int)>,_trompeloeil::delete_disposer>::~list
          (list<trompeloeil::condition_base<bool_(int)>,_trompeloeil::delete_disposer> *this)

{
  bool bVar1;
  condition_base<bool_(int)> *t;
  condition_base<bool_(int)> *elem;
  iterator local_18;
  iterator i;
  list<trompeloeil::condition_base<bool_(int)>,_trompeloeil::delete_disposer> *this_local;
  
  (this->super_list_elem<trompeloeil::condition_base<bool_(int)>_>)._vptr_list_elem =
       (_func_int **)&PTR__list_007c3308;
  i.p = &this->super_list_elem<trompeloeil::condition_base<bool_(int)>_>;
  local_18 = begin(this);
  while( true ) {
    elem = (condition_base<bool_(int)> *)end(this);
    bVar1 = trompeloeil::operator!=(&local_18,(iterator *)&elem);
    if (!bVar1) break;
    t = iterator::operator*(&local_18);
    iterator::operator++(&local_18);
    delete_disposer::dispose<trompeloeil::condition_base<bool(int)>>((delete_disposer *)this,t);
  }
  list_elem<trompeloeil::condition_base<bool_(int)>_>::~list_elem
            (&this->super_list_elem<trompeloeil::condition_base<bool_(int)>_>);
  return;
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto& elem = *i;
      ++i; // intrusive list, so advance before destroying
      Disposer::dispose(&elem);
    }
  }